

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::WriteLittleEndian64(CodedOutputStream *this,uint64 value)

{
  bool bVar1;
  uint8 *local_40;
  uint8 *ptr;
  uint8 local_20 [7];
  bool use_fast;
  uint8 bytes [8];
  uint64 value_local;
  CodedOutputStream *this_local;
  
  bVar1 = (uint)this->buffer_size_ < 8;
  if (bVar1) {
    local_40 = local_20;
  }
  else {
    local_40 = this->buffer_;
  }
  bytes = (uint8  [8])value;
  WriteLittleEndian64ToArray(value,local_40);
  if (bVar1) {
    WriteRaw(this,local_20,8);
  }
  else {
    Advance(this,8);
  }
  return;
}

Assistant:

void CodedOutputStream::WriteLittleEndian64(uint64 value) {
  uint8 bytes[sizeof(value)];

  bool use_fast = buffer_size_ >= sizeof(value);
  uint8* ptr = use_fast ? buffer_ : bytes;

  WriteLittleEndian64ToArray(value, ptr);

  if (use_fast) {
    Advance(sizeof(value));
  } else {
    WriteRaw(bytes, sizeof(value));
  }
}